

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::unary_go<unsigned_char>
          (Boxed_Number *this,Opers t_oper,uchar *t,Boxed_Value *t_lhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char cVar2;
  bad_any_cast *this_00;
  Boxed_Value BVar3;
  
  cVar2 = '\x01';
  if (t_oper != pre_increment) {
    if (t_oper != pre_decrement) {
      this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
      detail::exception::bad_any_cast::bad_any_cast(this_00);
      __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                  detail::exception::bad_any_cast::~bad_any_cast);
    }
    cVar2 = -1;
  }
  *t = *t + cVar2;
  (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (t_lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (t_lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value unary_go(Operators::Opers t_oper, T &t, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::pre_increment:
            ++t;
            break;
          case Operators::pre_decrement:
            --t;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }